

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O0

ssh_decompressor * zlib_decompress_init(void)

{
  undefined8 *puVar1;
  zlib_table *pzVar2;
  uchar local_138 [8];
  uchar lengths [288];
  zlib_decompress_ctx *dctx;
  
  puVar1 = (undefined8 *)safemalloc(1,0x81c8,0);
  memset(local_138,8,0x90);
  memset(lengths + 0x88,9,0x70);
  memset(lengths + 0xf8,7,0x18);
  memset(lengths + 0x110,8,8);
  pzVar2 = zlib_mktable(local_138,0x120);
  *puVar1 = pzVar2;
  memset(local_138,5,0x20);
  pzVar2 = zlib_mktable(local_138,0x20);
  puVar1[1] = pzVar2;
  *(undefined4 *)(puVar1 + 5) = 0;
  puVar1[4] = 0;
  puVar1[3] = 0;
  puVar1[2] = 0;
  puVar1[0x35] = 0;
  *(undefined4 *)(puVar1 + 0x36) = 0;
  *(undefined4 *)((long)puVar1 + 0x81b4) = 0;
  puVar1[0x1037] = 0;
  puVar1[0x1038] = &ssh_zlib;
  return (ssh_decompressor *)(puVar1 + 0x1038);
}

Assistant:

ssh_decompressor *zlib_decompress_init(void)
{
    struct zlib_decompress_ctx *dctx = snew(struct zlib_decompress_ctx);
    unsigned char lengths[288];

    memset(lengths, 8, 144);
    memset(lengths + 144, 9, 256 - 144);
    memset(lengths + 256, 7, 280 - 256);
    memset(lengths + 280, 8, 288 - 280);
    dctx->staticlentable = zlib_mktable(lengths, 288);
    memset(lengths, 5, 32);
    dctx->staticdisttable = zlib_mktable(lengths, 32);
    dctx->state = START;                       /* even before header */
    dctx->currlentable = dctx->currdisttable = dctx->lenlentable = NULL;
    dctx->bits = 0;
    dctx->nbits = 0;
    dctx->winpos = 0;
    dctx->outblk = NULL;

    dctx->dc.vt = &ssh_zlib;
    return &dctx->dc;
}